

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanLiteralContent(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  
  lVar8 = 0;
  do {
    lVar6 = (this->putStack).tos;
    if (lVar6 == -1) {
      lVar6 = this->readBufferPos;
      if ((this->readBuffer).d.size <= lVar6) {
        uVar9 = getChar_helper(this);
        goto LAB_0039aeb1;
      }
      this->readBufferPos = lVar6 + 1;
      uVar9 = (uint)(ushort)(this->readBuffer).d.ptr[lVar6];
    }
    else {
      if (this->atEnd != false) {
        return lVar8;
      }
      uVar9 = (this->putStack).data[lVar6];
      (this->putStack).tos = lVar6 + -1;
LAB_0039aeb1:
      if (uVar9 == 0xffffffff) {
        return lVar8;
      }
    }
    uVar2 = uVar9 & 0xffff;
    uVar3 = uVar9;
    if (uVar2 < 0xd) {
      if (uVar2 != 9) {
        if (uVar2 == 10) goto LAB_0039afa4;
        if (uVar2 != 0) goto LAB_0039af19;
LAB_0039afe4:
        puVar4 = (this->putStack).data;
        lVar7 = (this->putStack).tos;
        lVar6 = lVar7 + 1;
        lVar1 = (this->putStack).cap;
        if (lVar1 <= lVar6) {
          lVar7 = lVar7 + 2;
          lVar6 = lVar1 * 2;
          if (lVar7 != lVar6 && SBORROW8(lVar7,lVar6) == lVar7 + lVar1 * -2 < 0) {
            lVar6 = lVar7;
          }
          (this->putStack).cap = lVar6;
          puVar4 = (uint *)realloc(puVar4,lVar6 << 2);
          (this->putStack).data = puVar4;
          if (puVar4 == (uint *)0x0) {
LAB_0039b0b8:
            qBadAlloc();
          }
          lVar6 = (this->putStack).tos + 1;
        }
        (this->putStack).tos = lVar6;
        puVar4[lVar6] = uVar9;
        return lVar8;
      }
LAB_0039afc0:
      uVar3 = 0x20;
      if ((this->field_0x3a8 & 0x20) == 0) {
        uVar3 = uVar9;
      }
    }
    else if (uVar2 < 0x3d) {
      uVar5 = (ulong)uVar2;
      if ((0x100000c400000000U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 != 0xd) {
          if (uVar5 == 0x20) goto LAB_0039afc0;
          goto LAB_0039af0b;
        }
        lVar6 = (this->putStack).tos;
        if (lVar6 != -1) {
          uVar3 = (this->putStack).data[lVar6];
LAB_0039af75:
          if (uVar3 == 10) {
            lVar6 = (this->putStack).tos;
            if (lVar6 == -1) {
              this->readBufferPos = this->readBufferPos + 1;
            }
            else {
              (this->putStack).tos = lVar6 + -1;
            }
          }
          else if (uVar3 == 0xffffffff) goto LAB_0039b053;
LAB_0039afa4:
          this->lineNumber = this->lineNumber + 1;
          this->lastLineStart = this->readBufferPos + this->characterOffset;
          goto LAB_0039afc0;
        }
        if (this->readBufferPos < (this->readBuffer).d.size) {
          uVar3 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
          goto LAB_0039af75;
        }
        uVar3 = getChar_helper(this);
        if (uVar3 != 0xffffffff) {
          this->readBufferPos = this->readBufferPos + -1;
          goto LAB_0039af75;
        }
LAB_0039b053:
        puVar4 = (this->putStack).data;
        lVar7 = (this->putStack).tos;
        lVar6 = lVar7 + 1;
        lVar1 = (this->putStack).cap;
        if (lVar1 <= lVar6) {
          lVar7 = lVar7 + 2;
          lVar6 = lVar1 * 2;
          if (lVar7 != lVar6 && SBORROW8(lVar7,lVar6) == lVar7 + lVar1 * -2 < 0) {
            lVar6 = lVar7;
          }
          (this->putStack).cap = lVar6;
          puVar4 = (uint *)realloc(puVar4,lVar6 << 2);
          (this->putStack).data = puVar4;
          if (puVar4 == (uint *)0x0) goto LAB_0039b0b8;
          lVar6 = (this->putStack).tos + 1;
        }
        (this->putStack).tos = lVar6;
        puVar4[lVar6] = 0xd;
        return lVar8;
      }
      if ((uVar9 & 0xff0000) == 0) goto LAB_0039afe4;
    }
    else {
LAB_0039af0b:
      if (uVar2 - 0xfffe < 2) goto LAB_0039afe4;
LAB_0039af19:
      if (uVar9 < 0x20) goto LAB_0039afe4;
    }
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar3);
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanLiteralContent()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (ushort(c)) {
        case 0xfffe:
        case 0xffff:
        case 0:
            /* The putChar() call is necessary so the parser re-gets
             * the character from the input source, when raising an error. */
            putChar(c);
            return n;
        case '\r':
            if (filterCarriageReturn() == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            if (normalizeLiterals)
                textBuffer += u' ';
            else
                textBuffer += QChar(c);
            ++n;
            break;
        case '&':
        case '<':
        case '\"':
        case '\'':
            if (!(c & 0xff0000)) {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            if (c < 0x20) {
                putChar(c);
                return n;
            }
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }
    return n;
}